

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingSkewSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSkewSyntax,slang::syntax::ClockingSkewSyntax_const&>
          (BumpAllocator *this,ClockingSkewSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  TimingControlSyntax *pTVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ClockingSkewSyntax *pCVar10;
  
  pCVar10 = (ClockingSkewSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->edge).kind;
  uVar7 = (args->edge).field_0x2;
  NVar8.raw = (args->edge).numFlags.raw;
  uVar9 = (args->edge).rawLen;
  pIVar3 = (args->edge).info;
  pTVar4 = args->delay;
  (pCVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pCVar10->super_SyntaxNode).parent = pSVar1;
  (pCVar10->super_SyntaxNode).previewNode = pSVar2;
  (pCVar10->edge).kind = TVar6;
  (pCVar10->edge).field_0x2 = uVar7;
  (pCVar10->edge).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->edge).rawLen = uVar9;
  (pCVar10->edge).info = pIVar3;
  pCVar10->delay = pTVar4;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }